

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O0

void __thiscall restincurl::Request::~Request(Request *this)

{
  Request *this_local;
  
  if (this->headers_ != (headers_t)0x0) {
    curl_slist_free_all(this->headers_);
  }
  std::shared_ptr<_IO_FILE>::~shared_ptr(&this->fp_);
  std::__cxx11::string::~string((string *)&this->default_data_buffer_);
  std::unique_ptr<restincurl::DataHandlerBase,_std::default_delete<restincurl::DataHandlerBase>_>::
  ~unique_ptr(&this->default_in_handler_);
  std::unique_ptr<restincurl::DataHandlerBase,_std::default_delete<restincurl::DataHandlerBase>_>::
  ~unique_ptr(&this->default_out_handler_);
  std::function<void_(const_restincurl::Result_&)>::~function(&this->completion_);
  std::unique_ptr<restincurl::EasyHandle,_std::default_delete<restincurl::EasyHandle>_>::~unique_ptr
            (&this->eh_);
  return;
}

Assistant:

~Request() {
            if (headers_) {
                curl_slist_free_all(headers_);
            }
        }